

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

TestCaseGroup *
deqp::gles31::Functional::createChildCases
          (CaseType type,Context *ctx,char *name,char *desc,
          vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
          *funcs)

{
  Context *ctx_00;
  char *name_00;
  TestFunctionWrapper function;
  TestNode *this;
  TestContext *testCtx;
  size_type sVar1;
  const_reference pvVar2;
  TestNode *node;
  undefined1 in_stack_ffffffffffffff58 [12];
  CaseType CVar3;
  ulong local_50;
  size_t ndx;
  TestCaseGroup *host;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  *funcs_local;
  char *desc_local;
  char *name_local;
  Context *ctx_local;
  CaseType type_local;
  
  this = (TestNode *)operator_new(0x70);
  testCtx = gles31::Context::getTestContext(ctx);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,name,desc);
  local_50 = 0;
  while( true ) {
    sVar1 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
            ::size(funcs);
    if (sVar1 <= local_50) break;
    CVar3 = type;
    pvVar2 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             ::operator[](funcs,local_50);
    ctx_00 = (Context *)pvVar2->name;
    pvVar2 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             ::operator[](funcs,local_50);
    name_00 = pvVar2->desc;
    pvVar2 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             ::operator[](funcs,local_50);
    function.m_func._4_4_ = CVar3;
    function._0_12_ = in_stack_ffffffffffffff58;
    node = createCase((Functional *)(ulong)CVar3,(CaseType)ctx,ctx_00,name_00,
                      (char *)(*(ulong *)&pvVar2->function & 0xffffffff),function);
    tcu::TestNode::addChild(this,node);
    local_50 = local_50 + 1;
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createChildCases (CaseType type, Context& ctx, const char* name, const char* desc, const vector<FunctionContainer>& funcs)
{
	tcu::TestCaseGroup* host = new tcu::TestCaseGroup(ctx.getTestContext(), name, desc);

	for (size_t ndx = 0; ndx < funcs.size(); ndx++)
			host->addChild(createCase(type, ctx, funcs[ndx].name, funcs[ndx].desc, funcs[ndx].function));

	return host;
}